

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::strconv_cdata(char_t *s,char_t endch)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *__src;
  long lVar4;
  bool bVar5;
  
  __src = (byte *)0x0;
  lVar4 = 0;
  do {
    pbVar3 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[*pbVar3] & 0x10) == 0) {
      if (((anonymous_namespace)::chartype_table[pbVar3[1]] & 0x10) != 0) {
        pbVar3 = pbVar3 + 1;
        goto LAB_00332290;
      }
      if (((anonymous_namespace)::chartype_table[pbVar3[2]] & 0x10) != 0) {
        pbVar3 = pbVar3 + 2;
        goto LAB_00332290;
      }
      bVar5 = ((anonymous_namespace)::chartype_table[pbVar3[3]] & 0x10) == 0;
      if (bVar5) {
        pbVar3 = pbVar3 + 4;
      }
      else {
        pbVar3 = pbVar3 + 3;
      }
    }
    else {
LAB_00332290:
      bVar5 = false;
    }
    s = (char_t *)pbVar3;
    if (!bVar5) {
      bVar1 = *pbVar3;
      if (bVar1 == 0xd) {
        *pbVar3 = 10;
        s = (char_t *)(pbVar3 + 1);
        if (pbVar3[1] == 10) {
          if (__src != (byte *)0x0) {
            memmove(__src + -lVar4,__src,(long)(pbVar3 + 1) - (long)__src);
          }
          __src = pbVar3 + 2;
          lVar4 = lVar4 + 1;
          s = (char_t *)__src;
        }
      }
      else {
        if (bVar1 == 0x5d) {
          if ((pbVar3[1] == 0x5d) && ((pbVar3[2] == 0x3e || (endch == '>' && pbVar3[2] == 0)))) {
            pbVar2 = pbVar3;
            if (__src != (byte *)0x0) {
              memmove(__src + -lVar4,__src,(long)pbVar3 - (long)__src);
              pbVar2 = pbVar3 + -lVar4;
            }
            *pbVar2 = 0;
            return (char_t *)(pbVar3 + 1);
          }
        }
        else if (bVar1 == 0) {
          return (char_t *)0x0;
        }
        s = (char_t *)(pbVar3 + 1);
      }
    }
  } while( true );
}

Assistant:

PUGI_IMPL_FN char_t* strconv_cdata(char_t* s, char_t endch)
	{
		gap g;

		while (true)
		{
			PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_cdata));

			if (*s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
			{
				*s++ = '\n'; // replace first one with 0x0a

				if (*s == '\n') g.push(s, 1);
			}
			else if (s[0] == ']' && s[1] == ']' && PUGI_IMPL_ENDSWITH(s[2], '>')) // CDATA ends here
			{
				*g.flush(s) = 0;

				return s + 1;
			}
			else if (*s == 0)
			{
				return NULL;
			}
			else ++s;
		}
	}